

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pSVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar7;
  pointer pSVar8;
  byte *pbVar9;
  bool *pbVar10;
  ulong uVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar4 = this->cap;
  if (uVar11 < uVar4 * 2) {
    uVar11 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pSVar6 = (pointer)operator_new(uVar11 << 4);
  uVar3 = (args->super_SVIntStorage).bitWidth;
  bVar1 = (args->super_SVIntStorage).signFlag;
  bVar2 = (args->super_SVIntStorage).unknownFlag;
  *(uint *)((long)pSVar6 + lVar12 + 8) = uVar3;
  *(bool *)((long)pSVar6 + lVar12 + 0xc) = bVar1;
  *(bool *)((long)pSVar6 + lVar12 + 0xd) = bVar2;
  if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
    aVar7 = (args->super_SVIntStorage).field_0;
  }
  else {
    aVar7 = (args->super_SVIntStorage).field_0;
    (args->super_SVIntStorage).field_0.val = 0;
  }
  (((pointer)((long)pSVar6 + lVar12))->super_SVIntStorage).field_0 = aVar7;
  pSVar8 = this->data_;
  sVar5 = this->len;
  ctx = (EVP_PKEY_CTX *)(pSVar8 + sVar5);
  if (ctx == (EVP_PKEY_CTX *)pos) {
    if (sVar5 != 0) {
      pbVar10 = &(pSVar6->super_SVIntStorage).unknownFlag;
      do {
        uVar3 = (pSVar8->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar8->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pSVar8->super_SVIntStorage).unknownFlag;
        *(uint *)(pbVar10 + -5) = uVar3;
        pbVar10[-1] = bVar1;
        *pbVar10 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar7 = (pSVar8->super_SVIntStorage).field_0;
        }
        else {
          aVar7 = (pSVar8->super_SVIntStorage).field_0;
          (pSVar8->super_SVIntStorage).field_0.val = 0;
        }
        ((SVIntStorage *)(pbVar10 + -0xd))->field_0 = aVar7;
        pSVar8 = pSVar8 + 1;
        pbVar10 = pbVar10 + 0x10;
      } while (pSVar8 != pos);
    }
  }
  else {
    if (pSVar8 != pos) {
      pbVar10 = &(pSVar6->super_SVIntStorage).unknownFlag;
      do {
        uVar3 = (pSVar8->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar8->super_SVIntStorage).signFlag;
        bVar2 = (pSVar8->super_SVIntStorage).unknownFlag;
        *(uint *)(pbVar10 + -5) = uVar3;
        pbVar10[-1] = bVar1;
        *pbVar10 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          ctx = (EVP_PKEY_CTX *)(pSVar8->super_SVIntStorage).field_0.val;
        }
        else {
          ctx = (EVP_PKEY_CTX *)(pSVar8->super_SVIntStorage).field_0.val;
          (pSVar8->super_SVIntStorage).field_0.val = 0;
        }
        (((SVIntStorage *)(pbVar10 + -0xd))->field_0).val = (uint64_t)ctx;
        pSVar8 = pSVar8 + 1;
        pbVar10 = pbVar10 + 0x10;
      } while (pSVar8 != pos);
      pSVar8 = this->data_;
    }
    if (pSVar8 + sVar5 != pos) {
      pbVar9 = (byte *)((long)pSVar6 + lVar12 + 0x1d);
      do {
        uVar3 = (pos->super_SVIntStorage).bitWidth;
        bVar1 = (pos->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pos->super_SVIntStorage).unknownFlag;
        *(uint *)(pbVar9 + -5) = uVar3;
        pbVar9[-1] = bVar1;
        *pbVar9 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar7 = (pos->super_SVIntStorage).field_0;
        }
        else {
          aVar7 = (pos->super_SVIntStorage).field_0;
          (pos->super_SVIntStorage).field_0.val = 0;
        }
        *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(pbVar9 + -0xd) = aVar7;
        pos = pos + 1;
        pbVar9 = pbVar9 + 0x10;
      } while (pos != pSVar8 + sVar5);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pSVar6;
  return (pointer)((long)pSVar6 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}